

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_exception.hpp
# Opt level: O0

void __thiscall
duckdb::TransactionException::TransactionException<std::__cxx11::string,std::__cxx11::string>
          (TransactionException *this,string *msg,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_1)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  string *in_RDX;
  string *in_stack_ffffffffffffff48;
  string local_80 [32];
  string local_60 [32];
  string local_40 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *params_00;
  string *msg_00;
  
  params_00 = in_RCX;
  msg_00 = in_RDX;
  ::std::__cxx11::string::string(local_60,(string *)in_RDX);
  ::std::__cxx11::string::string(local_80,(string *)in_RCX);
  Exception::ConstructMessage<std::__cxx11::string,std::__cxx11::string>
            (msg_00,params_00,in_stack_ffffffffffffffd8);
  TransactionException((TransactionException *)in_RDX,in_stack_ffffffffffffff48);
  ::std::__cxx11::string::~string(local_40);
  ::std::__cxx11::string::~string(local_80);
  ::std::__cxx11::string::~string(local_60);
  return;
}

Assistant:

explicit TransactionException(const string &msg, ARGS... params)
	    : TransactionException(ConstructMessage(msg, params...)) {
	}